

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,duckdb::hugeint_t>
          (BaseAppender *this,Vector *col,long input)

{
  data_ptr_t pdVar1;
  long lVar2;
  hugeint_t hVar3;
  
  hVar3 = Cast::Operation<long,duckdb::hugeint_t>(input);
  pdVar1 = col->data;
  lVar2 = (this->chunk).count * 0x10;
  *(uint64_t *)(pdVar1 + lVar2) = hVar3.lower;
  *(int64_t *)(pdVar1 + lVar2 + 8) = hVar3.upper;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}